

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::setCapacity
          (Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this,size_t newSize)

{
  Entry *pEVar1;
  RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *pRVar2;
  Entry *pEVar3;
  size_t __n;
  ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> local_38;
  
  pEVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pEVar1 >> 4)) {
    (this->builder).pos = pEVar1 + newSize;
  }
  pEVar3 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                              (0x10,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  local_38.endPtr = pEVar3 + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pEVar1;
  local_38.ptr = pEVar3;
  if (__n != 0) {
    memcpy(pEVar3,pEVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)
                 ((long)pEVar3 + __n);
  ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::operator=
            (&this->builder,&local_38);
  pEVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pEVar1 = local_38.ptr;
  if (local_38.ptr != (Entry *)0x0) {
    local_38.ptr = (Entry *)0x0;
    local_38.pos = (RemoveConst<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)0x0;
    local_38.endPtr = (Entry *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pEVar1,0x10,(long)pRVar2 - (long)pEVar1 >> 4,
               (long)pEVar3 - (long)pEVar1 >> 4,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }